

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::writeTextFile(Recorder *this,string *filename)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  ostream *poVar5;
  ostream *poVar6;
  pointer pMVar7;
  size_type sVar8;
  string *in_RSI;
  long in_RDI;
  double dVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *mess;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *__range2_1;
  ValueCapture *point;
  iterator __end2;
  iterator __begin2;
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  *__range2;
  ofstream outFile;
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  *in_stack_fffffffffffffb38;
  Input *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  *in_stack_fffffffffffffb50;
  ostream *in_stack_fffffffffffffb58;
  ostream *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb68;
  size_t in_stack_fffffffffffffb70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  string *local_368;
  string local_338 [39];
  allocator<char> local_311;
  string_view local_310;
  string local_2e0 [32];
  reference local_2c0;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *local_2b8;
  __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
  local_2b0;
  long local_2a8;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  reference local_240;
  ValueCapture *local_238;
  __normal_iterator<helics::apps::Recorder::ValueCapture_*,_std::vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>_>
  local_230;
  long local_228;
  ostream local_210 [512];
  string *local_10;
  
  local_10 = in_RSI;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17c7c4);
  if (bVar1) {
    local_368 = (string *)(in_RDI + 0x60);
  }
  else {
    local_368 = local_10;
  }
  std::ofstream::ofstream(local_210,local_368,_S_out);
  bVar1 = CLI::std::
          vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
          ::empty(in_stack_fffffffffffffb50);
  if (!bVar1) {
    std::operator<<(local_210,"#time \ttag\t type*\t value\n");
  }
  local_228 = in_RDI + 0xb8;
  local_230._M_current =
       (ValueCapture *)
       CLI::std::
       vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
       ::begin(in_stack_fffffffffffffb38);
  local_238 = (ValueCapture *)
              CLI::std::
              vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
              ::end(in_stack_fffffffffffffb38);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::apps::Recorder::ValueCapture_*,_std::vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>_>
                           ((__normal_iterator<helics::apps::Recorder::ValueCapture_*,_std::vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>_>
                             *)in_stack_fffffffffffffb40,
                            (__normal_iterator<helics::apps::Recorder::ValueCapture_*,_std::vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>_>
                             *)in_stack_fffffffffffffb38), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_240 = __gnu_cxx::
                __normal_iterator<helics::apps::Recorder::ValueCapture_*,_std::vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>_>
                ::operator*(&local_230);
    if ((local_240->first & 1U) == 0) {
      if (local_240->iteration < 1) {
        dVar9 = TimeRepresentation::operator_cast_to_double
                          ((TimeRepresentation<count_time<9,_long>_> *)0x17cc12);
        poVar4 = (ostream *)std::ostream::operator<<(local_210,dVar9);
        poVar4 = std::operator<<(poVar4,"\t\t");
        CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::operator[]
                  ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffffb40
                   ,(size_type)in_stack_fffffffffffffb38);
        psVar3 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffffb40);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        poVar4 = std::operator<<(poVar4,'\t');
        generateJsonQuotedString(in_stack_fffffffffffffb68);
        poVar4 = std::operator<<(poVar4,local_2a0);
        std::operator<<(poVar4,'\n');
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
      }
      else {
        dVar9 = TimeRepresentation::operator_cast_to_double
                          ((TimeRepresentation<count_time<9,_long>_> *)0x17ca9e);
        poVar4 = (ostream *)std::ostream::operator<<(local_210,dVar9);
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_240->iteration);
        poVar4 = std::operator<<(poVar4,"\t\t");
        CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::operator[]
                  ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffffb40
                   ,(size_type)in_stack_fffffffffffffb38);
        psVar3 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffffb40);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        poVar4 = std::operator<<(poVar4,'\t');
        generateJsonQuotedString(in_stack_fffffffffffffb68);
        poVar4 = std::operator<<(poVar4,local_280);
        std::operator<<(poVar4,'\n');
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
      }
    }
    else {
      dVar9 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x17c8e7);
      poVar4 = (ostream *)std::ostream::operator<<(local_210,dVar9);
      poVar4 = std::operator<<(poVar4,"\t\t");
      CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::operator[]
                ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffffb40,
                 (size_type)in_stack_fffffffffffffb38);
      psVar3 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffffb40);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      poVar4 = std::operator<<(poVar4,'\t');
      CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::operator[]
                ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffffb40,
                 (size_type)in_stack_fffffffffffffb38);
      psVar3 = Input::getPublicationType_abi_cxx11_(in_stack_fffffffffffffb40);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      poVar4 = std::operator<<(poVar4,'\t');
      generateJsonQuotedString(in_stack_fffffffffffffb68);
      poVar4 = std::operator<<(poVar4,local_260);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb40);
    }
    __gnu_cxx::
    __normal_iterator<helics::apps::Recorder::ValueCapture_*,_std::vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>_>
    ::operator++(&local_230);
  }
  bVar1 = CLI::std::
          vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ::empty((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   *)in_stack_fffffffffffffb50);
  if (!bVar1) {
    std::operator<<(local_210,"# m\t time \tsource\t dest\t message\n");
  }
  local_2a8 = in_RDI + 400;
  local_2b0._M_current =
       (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
       CLI::std::
       vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
       ::begin((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                *)in_stack_fffffffffffffb38);
  local_2b8 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
              CLI::std::
              vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ::end((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                     *)in_stack_fffffffffffffb38);
  sVar11._M_str = (char *)in_stack_fffffffffffffb68;
  sVar11._M_len = in_stack_fffffffffffffb70;
  sVar12._M_str = in_stack_fffffffffffffb48;
  sVar12._M_len = (size_t)in_stack_fffffffffffffb50;
  do {
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                      ((__normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                        *)in_stack_fffffffffffffb40,
                       (__normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                        *)in_stack_fffffffffffffb38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::ofstream::~ofstream(local_210);
      return;
    }
    local_2c0 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                ::operator*(&local_2b0);
    poVar4 = std::operator<<(local_210,"m\t");
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x17ce1d);
    dVar9 = TimeRepresentation::operator_cast_to_double
                      ((TimeRepresentation<count_time<9,_long>_> *)0x17ce25);
    poVar5 = (ostream *)std::ostream::operator<<(poVar4,dVar9);
    poVar6 = std::operator<<(poVar5,'\t');
    pMVar7 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
             operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                        0x17ce65);
    poVar6 = std::operator<<(poVar6,(string *)&pMVar7->source);
    std::operator<<(poVar6,'\t');
    pMVar7 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
             operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                        0x17cea7);
    sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(&pMVar7->dest);
    if (sVar8 < 7) {
LAB_0017cf1a:
      pMVar7 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
               operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x17cf27);
      std::operator<<(local_210,(string *)&pMVar7->dest);
    }
    else {
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x17cec6);
      pMVar7 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
               operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x17cedc);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&pMVar7->dest);
      iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      sVar11._M_len,(size_type)sVar11._M_str,(size_type)in_stack_fffffffffffffb60,
                      (char *)in_stack_fffffffffffffb58);
      if (iVar2 != 0) goto LAB_0017cf1a;
      pMVar7 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
               operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x17cf4c);
      std::operator<<(local_210,(string *)&pMVar7->original_dest);
    }
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x17cf74);
    bVar1 = isBinaryData((SmallBuffer *)sVar12._M_len);
    if (bVar1) {
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x17cfa0);
      bVar1 = isEscapableData((SmallBuffer *)sVar12._M_len);
      if (bVar1) {
        poVar4 = std::operator<<(local_210,"\t");
        CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x17cfe7);
        sVar10 = SmallBuffer::to_string((SmallBuffer *)0x17cff3);
        local_310 = sVar10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                   (allocator<char> *)sVar11._M_len);
        generateJsonQuotedString((string *)sVar11._M_str);
        in_stack_fffffffffffffb80 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(poVar4,local_2e0);
        std::operator<<((ostream *)in_stack_fffffffffffffb80,"\n");
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
        std::allocator<char>::~allocator(&local_311);
      }
      else {
        in_stack_fffffffffffffb78 =
             (basic_string_view<char,_std::char_traits<char>_> *)std::operator<<(local_210,"\t\"");
        CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x17d14a);
        sVar11 = SmallBuffer::to_string((SmallBuffer *)0x17d156);
        sVar10._M_str = (char *)poVar4;
        sVar10._M_len = (size_t)poVar5;
        encode_abi_cxx11_(sVar10);
        in_stack_fffffffffffffb60 = std::operator<<((ostream *)in_stack_fffffffffffffb78,local_338);
        std::operator<<(in_stack_fffffffffffffb60,"\"\n");
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
      }
    }
    else {
      in_stack_fffffffffffffb58 = std::operator<<(local_210,"\t\"");
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x17d229);
      sVar12 = SmallBuffer::to_string((SmallBuffer *)0x17d235);
      __str._M_str = (char *)sVar12._M_len;
      __str._M_len = (size_t)sVar12._M_str;
      in_stack_fffffffffffffb40 =
           (Input *)std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                    in_stack_fffffffffffffb40,__str);
      std::operator<<((ostream *)in_stack_fffffffffffffb40,"\"\n");
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
    ::operator++(&local_2b0);
  } while( true );
}

Assistant:

void Recorder::writeTextFile(const std::string& filename)
{
    std::ofstream outFile(filename.empty() ? outFileName : filename);
    if (!points.empty()) {
        outFile << "#time \ttag\t type*\t value\n";
    }
    for (auto& point : points) {
        if (point.first) {
            outFile << static_cast<double>(point.time) << "\t\t"
                    << subscriptions[point.index].getTarget() << '\t'
                    << subscriptions[point.index].getPublicationType() << '\t'
                    << generateJsonQuotedString(point.value) << '\n';
        } else {
            if (point.iteration > 0) {
                outFile << static_cast<double>(point.time) << ':' << point.iteration << "\t\t"
                        << subscriptions[point.index].getTarget() << '\t'
                        << generateJsonQuotedString(point.value) << '\n';
            } else {
                outFile << static_cast<double>(point.time) << "\t\t"
                        << subscriptions[point.index].getTarget() << '\t'
                        << generateJsonQuotedString(point.value) << '\n';
            }
        }
    }
    if (!messages.empty()) {
        outFile << "# m\t time \tsource\t dest\t message\n";
    }
    for (auto& mess : messages) {
        outFile << "m\t" << static_cast<double>(mess->time) << '\t' << mess->source << '\t';
        if ((mess->dest.size() < 7) ||
            (mess->dest.compare(mess->dest.size() - 6, 6, "cloneE") != 0)) {
            outFile << mess->dest;
        } else {
            outFile << mess->original_dest;
        }
        if (isBinaryData(mess->data)) {
            if (isEscapableData(mess->data)) {
                outFile << "\t" << generateJsonQuotedString(std::string(mess->data.to_string()))
                        << "\n";
            } else {
                outFile << "\t\"" << encode(mess->data.to_string()) << "\"\n";
            }

        } else {
            outFile << "\t\"" << mess->data.to_string() << "\"\n";
        }
    }
}